

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall PSEngine::undo(PSEngine *this)

{
  pointer pLVar1;
  pointer pLVar2;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [48];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  Operation::Operation((Operation *)local_50,Undo,None,-1,&local_70);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::
  emplace_back<PSEngine::Operation>(&this->m_operation_history,(Operation *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  std::__cxx11::string::~string((string *)&local_70);
  pLVar1 = (this->m_level_state_stack).
           super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->m_level_state_stack).
           super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar2 != pLVar1) {
    Level::operator=(&this->m_current_level,pLVar2 + -1);
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::pop_back
              (&this->m_level_state_stack);
  }
  return pLVar2 != pLVar1;
}

Assistant:

bool PSEngine::undo()
{
    m_operation_history.push_back(Operation(OperationType::Undo));

    if(m_level_state_stack.size() == 0)
    {
        return false;
    }

    m_current_level = m_level_state_stack.back();
    m_level_state_stack.pop_back();

    return true; //todo ? shouln't we return deltas for undos ?
}